

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O1

int run_test_udp_bind(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *handle;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  sockaddr_in sStack_390;
  undefined1 auStack_380 [216];
  undefined1 auStack_2a8 [240];
  uv_udp_t local_1b8;
  uv_udp_t local_e0;
  
  auStack_2a8._216_8_ = (void *)0x184090;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)(auStack_2a8 + 0xe0));
  if (iVar1 == 0) {
    auStack_2a8._216_8_ = (void *)0x18409d;
    unaff_RBX = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x1840b0;
    iVar1 = uv_udp_init(unaff_RBX,&local_e0);
    if (iVar1 != 0) goto LAB_00184171;
    auStack_2a8._216_8_ = (void *)0x1840c5;
    iVar1 = uv_udp_init(unaff_RBX,&local_1b8);
    if (iVar1 != 0) goto LAB_00184176;
    auStack_2a8._216_8_ = (void *)0x1840df;
    iVar1 = uv_udp_bind(&local_e0,(sockaddr *)(auStack_2a8 + 0xe0),0);
    if (iVar1 != 0) goto LAB_0018417b;
    auStack_2a8._216_8_ = (void *)0x1840f6;
    iVar1 = uv_udp_bind(&local_1b8,(sockaddr *)(auStack_2a8 + 0xe0),0);
    if (iVar1 != -0x62) goto LAB_00184180;
    auStack_2a8._216_8_ = (void *)0x18410e;
    uv_close((uv_handle_t *)&local_e0,(uv_close_cb)0x0);
    auStack_2a8._216_8_ = (void *)0x18411a;
    uv_close((uv_handle_t *)&local_1b8,(uv_close_cb)0x0);
    auStack_2a8._216_8_ = (void *)0x184124;
    iVar1 = uv_run(unaff_RBX,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00184185;
    auStack_2a8._216_8_ = (void *)0x18412d;
    unaff_RBX = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x184141;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_2a8._216_8_ = (void *)0x18414b;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_2a8._216_8_ = (void *)0x184150;
    puVar2 = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x184158;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      auStack_2a8._216_8_ = (void *)0x184161;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_2a8._216_8_ = (void *)0x184171;
    run_test_udp_bind_cold_1();
LAB_00184171:
    auStack_2a8._216_8_ = (void *)0x184176;
    run_test_udp_bind_cold_2();
LAB_00184176:
    auStack_2a8._216_8_ = (void *)0x18417b;
    run_test_udp_bind_cold_3();
LAB_0018417b:
    auStack_2a8._216_8_ = (void *)0x184180;
    run_test_udp_bind_cold_4();
LAB_00184180:
    auStack_2a8._216_8_ = (void *)0x184185;
    run_test_udp_bind_cold_5();
LAB_00184185:
    auStack_2a8._216_8_ = (void *)0x18418a;
    run_test_udp_bind_cold_6();
  }
  auStack_2a8._216_8_ = run_test_udp_bind_reuseaddr;
  run_test_udp_bind_cold_7();
  handle = "0.0.0.0";
  auStack_2a8._216_8_ = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_390);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    handle = (char *)puVar2;
    iVar1 = uv_udp_init(puVar2,(uv_udp_t *)auStack_2a8);
    if (iVar1 != 0) goto LAB_00184291;
    handle = (char *)puVar2;
    iVar1 = uv_udp_init(puVar2,(uv_udp_t *)auStack_380);
    if (iVar1 != 0) goto LAB_00184296;
    handle = auStack_2a8;
    iVar1 = uv_udp_bind((uv_udp_t *)handle,(sockaddr *)&sStack_390,4);
    if (iVar1 != 0) goto LAB_0018429b;
    handle = auStack_380;
    iVar1 = uv_udp_bind((uv_udp_t *)handle,(sockaddr *)&sStack_390,4);
    if (iVar1 != 0) goto LAB_001842a0;
    uv_close((uv_handle_t *)auStack_2a8,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)auStack_380,(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001842aa;
    }
  }
  else {
    run_test_udp_bind_reuseaddr_cold_1();
LAB_00184291:
    run_test_udp_bind_reuseaddr_cold_2();
LAB_00184296:
    run_test_udp_bind_reuseaddr_cold_3();
LAB_0018429b:
    run_test_udp_bind_reuseaddr_cold_4();
LAB_001842a0:
    puVar2 = (uv_loop_t *)handle;
    run_test_udp_bind_reuseaddr_cold_5();
  }
  run_test_udp_bind_reuseaddr_cold_6();
LAB_001842aa:
  run_test_udp_bind_reuseaddr_cold_7();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_bind) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT(r == 0);

  r = uv_udp_init(loop, &h2);
  ASSERT(r == 0);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}